

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

btMatrixX<float> * __thiscall
btMatrixX<float>::transpose(btMatrixX<float> *__return_storage_ptr__,btMatrixX<float> *this)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  long lVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  
  btMatrixX(__return_storage_ptr__,this->m_cols,this->m_rows);
  setZero(__return_storage_ptr__);
  lVar5 = (long)this->m_cols;
  if (0 < lVar5) {
    uVar2 = this->m_rows;
    pfVar6 = (this->m_storage).m_data;
    iVar7 = __return_storage_ptr__->m_setElemOperations;
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (0 < (int)uVar2) {
        iVar3 = __return_storage_ptr__->m_cols;
        pfVar4 = (__return_storage_ptr__->m_storage).m_data;
        uVar11 = 0;
        pfVar10 = pfVar6;
        do {
          fVar1 = *pfVar10;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            iVar7 = iVar7 + 1;
            __return_storage_ptr__->m_setElemOperations = iVar7;
            *(float *)((long)pfVar4 + uVar11 * 4 + iVar3 * lVar8) = fVar1;
          }
          uVar11 = uVar11 + 1;
          pfVar10 = pfVar10 + lVar5;
        } while (uVar2 != uVar11);
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 4;
      pfVar6 = pfVar6 + 1;
    } while (lVar9 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

btMatrixX transpose() const
	{
		//transpose is optimized for sparse matrices
		btMatrixX tr(m_cols,m_rows);
		tr.setZero();
		for (int i=0;i<m_cols;i++)
			for (int j=0;j<m_rows;j++)
			{
				T v = (*this)(j,i);
				if (v)
				{
					tr.setElem(i,j,v);
				}
			}
		return tr;
	}